

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleDynamicsWorld.cpp
# Opt level: O0

void __thiscall btSimpleDynamicsWorld::clearForces(btSimpleDynamicsWorld *this)

{
  int iVar1;
  btRigidBody *this_00;
  long in_RDI;
  btRigidBody *body;
  btCollisionObject *colObj;
  int i;
  btCollisionObject *in_stack_ffffffffffffffc8;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    iVar1 = btAlignedObjectArray<btCollisionObject_*>::size
                      ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8));
    if (iVar1 <= local_c) break;
    btAlignedObjectArray<btCollisionObject_*>::operator[]
              ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 8),local_c);
    this_00 = btRigidBody::upcast(in_stack_ffffffffffffffc8);
    if (this_00 != (btRigidBody *)0x0) {
      btRigidBody::clearForces(this_00);
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void	btSimpleDynamicsWorld::clearForces()
{
	///@todo: iterate over awake simulation islands!
	for ( int i=0;i<m_collisionObjects.size();i++)
	{
		btCollisionObject* colObj = m_collisionObjects[i];
		
		btRigidBody* body = btRigidBody::upcast(colObj);
		if (body)
		{
			body->clearForces();
		}
	}
}